

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall AutoFile::~AutoFile(AutoFile *this)

{
  FILE *in_RSI;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  vector<std::byte,_std::allocator<std::byte>_> *this_00;
  
  this_00 = *(vector<std::byte,_std::allocator<std::byte>_> **)(in_FS_OFFSET + 0x28);
  fclose(in_RDI,in_RSI);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(this_00);
  if (*(vector<std::byte,_std::allocator<std::byte>_> **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~AutoFile() { fclose(); }